

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,size_type n)

{
  size_t sVar1;
  ulong in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  size_t i_1;
  size_t i;
  float *in_stack_ffffffffffffffb8;
  polymorphic_allocator<float> *in_stack_ffffffffffffffc0;
  ulong uVar2;
  ulong n_00;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffffe0;
  ulong local_18;
  
  n_00 = in_RSI;
  sVar1 = size(in_RDI);
  local_18 = in_RSI;
  if (n_00 < sVar1) {
    for (; sVar1 = size(in_RDI), local_18 < sVar1; local_18 = local_18 + 1) {
      pmr::polymorphic_allocator<float>::destroy<float>(&in_RDI->alloc,in_RDI->ptr + local_18);
    }
    if (in_RSI == 0) {
      pmr::polymorphic_allocator<float>::deallocate_object<float>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x264217);
      in_RDI->ptr = (float *)0x0;
      in_RDI->nAlloc = 0;
    }
  }
  else {
    uVar2 = in_RSI;
    sVar1 = size(in_RDI);
    if (sVar1 < uVar2) {
      reserve(in_stack_ffffffffffffffe0,n_00);
      for (sVar1 = in_RDI->nStored; sVar1 < in_RSI; sVar1 = sVar1 + 1) {
        pmr::polymorphic_allocator<float>::construct<float>(&in_RDI->alloc,in_RDI->ptr + sVar1);
      }
    }
  }
  in_RDI->nStored = in_RSI;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; i < size(); ++i)
                alloc.destroy(ptr + i);
            if (n == 0) {
                alloc.deallocate_object(ptr, nAlloc);
                ptr = nullptr;
                nAlloc = 0;
            }
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(ptr + i);
        }
        nStored = n;
    }